

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloatExpanded
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  bool bVar1;
  qpTestResult qVar2;
  GLint64 GVar3;
  int *piVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  Hex<8UL> local_1e0;
  Hex<8UL> local_1d8;
  Hex<8UL> local_1d0 [3];
  MessageBuilder local_1b8;
  undefined1 local_34 [8];
  StateQueryMemoryWriteGuard<int> state;
  GLint expectedGLStateMin;
  GLint expectedGLStateMax;
  GLfloat reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetIntegerVerifier *this_local;
  
  GVar3 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference);
  state.m_postguard = FloatStateQueryVerifiers::anon_unknown_0::clampToGLint(GVar3 + 0x3ff);
  GVar3 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference);
  state.m_value = FloatStateQueryVerifiers::anon_unknown_0::clampToGLint(GVar3 + -0x3ff);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_34);
  piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_34);
  glu::CallLogWrapper::glGetIntegerv(&(this->super_StateVerifier).super_CallLogWrapper,name,piVar4);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_34,testCtx);
  if ((bVar1) &&
     ((piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                          ((StateQueryMemoryWriteGuard *)local_34), *piVar4 < state.m_value ||
      (piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                          ((StateQueryMemoryWriteGuard *)local_34), state.m_postguard < *piVar4))))
  {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [30])"// ERROR: expected in range [");
    local_1d0[0] = tcu::toHex<int>(state.m_value);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1d0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2c6b075);
    local_1d8 = tcu::toHex<int>(state.m_postguard);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1d8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])"]; got ");
    piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_34);
    local_1e0 = tcu::toHex<int>(*piVar4);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1e0);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyFloatExpanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	DE_ASSERT(de::inRange(reference, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint expectedGLStateMax = clampToGLint(expandGLFloatToInteger(reference) + FLOAT_EXPANSION_E);
	const GLint expectedGLStateMin = clampToGLint(expandGLFloatToInteger(reference) - FLOAT_EXPANSION_E);

	StateQueryMemoryWriteGuard<GLint> state;
	glGetIntegerv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < expectedGLStateMin || state > expectedGLStateMax)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected in range [" << toHex(expectedGLStateMin) << "," << toHex(expectedGLStateMax) << "]; got " << toHex((GLint)state) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}